

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

uint64_t sum_quotients_vec<unsigned_short,libdivide::divider<unsigned_short,(libdivide::Branching)0>>
                   (random_numerators<unsigned_short> *vals,
                   divider<unsigned_short,_(libdivide::Branching)0> *div)

{
  __m512i numers_00;
  __m512i sumX4_00;
  undefined1 (*pauVar1) [64];
  uint64_t uVar2;
  ushort *in_RSI;
  random_numerators<unsigned_short> *in_RDI;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  __m512i numers;
  const_iterator iter;
  __m512i sumX4;
  size_t count;
  size_t loop;
  type_pun_vec input;
  type_pun_vec result;
  size_t count_1;
  uint16_t t;
  uint16_t q;
  uint32_t rl;
  uint32_t yl;
  uint32_t xl;
  undefined8 in_stack_fffffffffffffb80;
  random_numerators<unsigned_short> *in_stack_fffffffffffffb88;
  undefined1 in_stack_fffffffffffffb90 [40];
  undefined1 (*pauVar5) [64];
  undefined1 auVar6 [56];
  undefined1 (*local_3c8) [64];
  undefined1 local_3c0 [64];
  size_t local_358;
  ushort *local_350;
  undefined1 local_340 [64];
  undefined1 (*local_2d0) [64];
  ushort *local_2c8;
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  ushort *local_208;
  undefined1 local_200 [64];
  ushort *local_190;
  ulong local_188;
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined8 local_d0;
  ushort *local_c8;
  undefined1 local_c0 [64];
  ushort *local_78;
  ushort local_6e;
  ushort local_6c;
  ushort local_6a;
  byte local_67;
  ushort local_66;
  ushort local_64;
  undefined2 local_62;
  int local_60;
  uint local_5c;
  uint local_58;
  ushort local_54;
  ushort local_52;
  
  local_358 = 0x20;
  local_340 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  auVar3 = vmovdqa64_avx512f(local_340);
  local_3c0 = vmovdqa64_avx512f(auVar3);
  local_350 = in_RSI;
  local_3c8 = (undefined1 (*) [64])random_numerators<unsigned_short>::begin(in_RDI);
  while( true ) {
    pauVar5 = local_3c8;
    pauVar1 = (undefined1 (*) [64])random_numerators<unsigned_short>::end(in_stack_fffffffffffffb88)
    ;
    if (pauVar5 == pauVar1) break;
    local_2d0 = local_3c8;
    auVar3 = vmovdqa64_avx512f(*local_3c8);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar3);
    local_2c0 = vmovdqa64_avx512f(auVar3);
    local_2c8 = local_350;
    auVar3 = vmovdqa64_avx512f(local_2c0);
    local_208 = local_350;
    local_280 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_280);
    local_190 = local_350;
    local_200 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_200);
    local_c0 = vmovdqa64_avx512f(auVar3);
    local_c8 = local_350;
    local_d0 = 0x20;
    auVar3 = vmovdqa64_avx512f(local_c0);
    local_180 = vmovdqa64_avx512f(auVar3);
    for (local_188 = 0; local_188 < 0x20; local_188 = local_188 + 1) {
      local_6e = *(ushort *)(local_180 + local_188 * 2);
      local_78 = local_350;
      local_66 = *local_350;
      local_67 = (byte)local_350[1];
      if (local_66 == 0) {
        local_62 = (undefined2)((int)(uint)local_6e >> (local_67 & 0x1f));
      }
      else {
        local_58 = (uint)local_6e;
        local_5c = (uint)local_66;
        local_60 = local_58 * local_5c;
        local_6a = (ushort)((uint)local_60 >> 0x10);
        local_54 = local_66;
        local_52 = local_6e;
        if ((local_67 & 0x40) == 0) {
          local_62 = (undefined2)((int)(uint)local_6a >> (local_67 & 0x1f));
        }
        else {
          local_6c = (short)((int)((uint)local_6e - (uint)local_6a) >> 1) + local_6a;
          local_62 = (undefined2)((int)(uint)local_6c >> (local_67 & 0x1f));
        }
      }
      *(undefined2 *)(local_140 + local_188 * 2) = local_62;
      local_64 = local_6e;
    }
    auVar3 = vmovdqa64_avx512f(local_140);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar6 = auVar3._0_56_;
    auVar4 = vmovdqa64_avx512f(local_3c0);
    vmovdqa64_avx512f(auVar3);
    sumX4_00[1] = auVar6._0_8_;
    sumX4_00[2] = auVar6._8_8_;
    sumX4_00[3] = auVar6._16_8_;
    sumX4_00[4] = auVar6._24_8_;
    sumX4_00[5] = auVar6._32_8_;
    sumX4_00[6] = auVar6._40_8_;
    sumX4_00[7] = auVar6._48_8_;
    sumX4_00[0] = (longlong)pauVar5;
    numers_00[1] = in_stack_fffffffffffffb80;
    numers_00[0] = 0x1052fc;
    numers_00[2] = (longlong)in_stack_fffffffffffffb88;
    numers_00[3] = in_stack_fffffffffffffb90._0_8_;
    numers_00[4] = in_stack_fffffffffffffb90._8_8_;
    numers_00[5] = in_stack_fffffffffffffb90._16_8_;
    numers_00[6] = in_stack_fffffffffffffb90._24_8_;
    numers_00[7] = in_stack_fffffffffffffb90._32_8_;
    add_vector<2ul>(sumX4_00,numers_00);
    local_3c0 = vmovdqa64_avx512f(auVar4);
    local_3c8 = (undefined1 (*) [64])(*local_3c8 + local_358 * 2);
  }
  uVar2 = unsigned_sum_vals<unsigned_short>((unsigned_short *)local_3c0,local_358);
  return uVar2;
}

Assistant:

NOINLINE uint64_t sum_quotients_vec(const random_numerators<IntT> &vals, const Divisor &div) {
    size_t count = sizeof(x86_VECTOR_TYPE) / sizeof(IntT);
    x86_VECTOR_TYPE sumX4 = SETZERO_SI();
    for (auto iter = vals.begin(); iter != vals.end(); iter += count) {
        x86_VECTOR_TYPE numers = LOAD_SI((const x86_VECTOR_TYPE *)iter);
        numers = numers / div;
        sumX4 = add_vector<sizeof(IntT)>(sumX4, numers);
    }
    return unsigned_sum_vals((const IntT *)&sumX4, count);
}